

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

float Abc_NtkDelayTraceLut(Abc_Ntk_t *pNtk,int fUseLutLib)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  float *pfVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  float fVar10;
  float fVar11;
  void *local_170;
  int local_168;
  int local_164;
  int k;
  int i;
  float *pDelays;
  float tSlack;
  float tRequired;
  float tArrival;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  If_LibLut_t *pLutLib;
  float pPinDelays [32];
  int pPinPerm [32];
  int fUseSorting;
  int fUseLutLib_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkIsLogic(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                  ,0x6f,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
  }
  if (fUseLutLib == 0) {
    local_170 = (void *)0x0;
  }
  else {
    local_170 = Abc_FrameReadLibLut();
  }
  if ((local_170 == (void *)0x0) ||
     (iVar3 = *(int *)((long)local_170 + 8), iVar4 = Abc_NtkGetFaninMax(pNtk), iVar4 <= iVar3)) {
    if (pNtk->pLutTimes != (float *)0x0) {
      free(pNtk->pLutTimes);
      pNtk->pLutTimes = (float *)0x0;
    }
    iVar3 = Abc_NtkObjNumMax(pNtk);
    pfVar6 = (float *)malloc((long)(iVar3 * 3) << 2);
    pNtk->pLutTimes = pfVar6;
    for (local_164 = 0; iVar3 = Abc_NtkObjNumMax(pNtk), local_164 < iVar3; local_164 = local_164 + 1
        ) {
      pNtk->pLutTimes[local_164 * 3 + 2] = 0.0;
      pNtk->pLutTimes[local_164 * 3] = 0.0;
      pNtk->pLutTimes[local_164 * 3 + 1] = 1e+09;
    }
    pVVar7 = Abc_NtkDfs(pNtk,1);
    for (local_164 = 0; iVar3 = Vec_PtrSize(pVVar7), local_164 < iVar3; local_164 = local_164 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVVar7,local_164);
      tSlack = -1e+09;
      if (local_170 == (void *)0x0) {
        for (local_168 = 0; iVar3 = Abc_ObjFaninNum(pAVar8), local_168 < iVar3;
            local_168 = local_168 + 1) {
          pAVar9 = Abc_ObjFanin(pAVar8,local_168);
          fVar10 = Abc_ObjArrival(pAVar9);
          if (tSlack < fVar10 + 1.0) {
            fVar10 = Abc_ObjArrival(pAVar9);
            tSlack = fVar10 + 1.0;
          }
        }
      }
      else if (*(int *)((long)local_170 + 0xc) == 0) {
        iVar3 = Abc_ObjFaninNum(pAVar8);
        pfVar6 = (float *)((long)local_170 + (long)iVar3 * 0x84 + 0x94);
        for (local_168 = 0; iVar3 = Abc_ObjFaninNum(pAVar8), local_168 < iVar3;
            local_168 = local_168 + 1) {
          pAVar9 = Abc_ObjFanin(pAVar8,local_168);
          fVar10 = Abc_ObjArrival(pAVar9);
          if (tSlack < fVar10 + *pfVar6) {
            fVar10 = Abc_ObjArrival(pAVar9);
            tSlack = fVar10 + *pfVar6;
          }
        }
      }
      else {
        iVar3 = Abc_ObjFaninNum(pAVar8);
        lVar2 = (long)iVar3 * 0x84 + 0x94;
        Abc_NtkDelayTraceSortPins(pAVar8,(int *)(pPinDelays + 0x1e),(float *)&pLutLib);
        for (local_168 = 0; iVar3 = Abc_ObjFaninNum(pAVar8), local_168 < iVar3;
            local_168 = local_168 + 1) {
          Abc_ObjFanin(pAVar8,local_168);
          pAVar9 = Abc_ObjFanin(pAVar8,(int)pPinDelays[(long)local_168 + 0x1e]);
          fVar10 = Abc_ObjArrival(pAVar9);
          if (tSlack < fVar10 + *(float *)((long)local_170 + (long)local_168 * 4 + lVar2)) {
            pAVar9 = Abc_ObjFanin(pAVar8,(int)pPinDelays[(long)local_168 + 0x1e]);
            fVar10 = Abc_ObjArrival(pAVar9);
            tSlack = fVar10 + *(float *)((long)local_170 + (long)local_168 * 4 + lVar2);
          }
        }
      }
      iVar3 = Abc_ObjFaninNum(pAVar8);
      if (iVar3 == 0) {
        tSlack = 0.0;
      }
      Abc_ObjSetArrival(pAVar8,tSlack);
    }
    Vec_PtrFree(pVVar7);
    tSlack = -1e+09;
    for (local_164 = 0; iVar3 = Abc_NtkCoNum(pNtk), local_164 < iVar3; local_164 = local_164 + 1) {
      pAVar8 = Abc_NtkCo(pNtk,local_164);
      pAVar9 = Abc_ObjFanin0(pAVar8);
      fVar10 = Abc_ObjArrival(pAVar9);
      if (tSlack < fVar10) {
        pAVar8 = Abc_ObjFanin0(pAVar8);
        tSlack = Abc_ObjArrival(pAVar8);
      }
    }
    for (local_164 = 0; iVar3 = Abc_NtkCoNum(pNtk), local_164 < iVar3; local_164 = local_164 + 1) {
      pAVar8 = Abc_NtkCo(pNtk,local_164);
      pAVar9 = Abc_ObjFanin0(pAVar8);
      fVar10 = Abc_ObjRequired(pAVar9);
      if (tSlack < fVar10) {
        pAVar8 = Abc_ObjFanin0(pAVar8);
        Abc_ObjSetRequired(pAVar8,tSlack);
      }
    }
    pVVar7 = Abc_NtkDfsReverse(pNtk);
    for (local_164 = 0; iVar3 = Vec_PtrSize(pVVar7), local_164 < iVar3; local_164 = local_164 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVVar7,local_164);
      if (local_170 == (void *)0x0) {
        fVar10 = Abc_ObjRequired(pAVar8);
        for (local_168 = 0; iVar3 = Abc_ObjFaninNum(pAVar8), local_168 < iVar3;
            local_168 = local_168 + 1) {
          pAVar9 = Abc_ObjFanin(pAVar8,local_168);
          fVar11 = Abc_ObjRequired(pAVar9);
          if (fVar10 - 1.0 < fVar11) {
            Abc_ObjSetRequired(pAVar9,fVar10 - 1.0);
          }
        }
      }
      else if (*(int *)((long)local_170 + 0xc) == 0) {
        iVar3 = Abc_ObjFaninNum(pAVar8);
        fVar10 = Abc_ObjRequired(pAVar8);
        fVar10 = fVar10 - *(float *)((long)local_170 + (long)iVar3 * 0x84 + 0x94);
        for (local_168 = 0; iVar3 = Abc_ObjFaninNum(pAVar8), local_168 < iVar3;
            local_168 = local_168 + 1) {
          pAVar9 = Abc_ObjFanin(pAVar8,local_168);
          fVar11 = Abc_ObjRequired(pAVar9);
          if (fVar10 < fVar11) {
            Abc_ObjSetRequired(pAVar9,fVar10);
          }
        }
      }
      else {
        iVar3 = Abc_ObjFaninNum(pAVar8);
        Abc_NtkDelayTraceSortPins(pAVar8,(int *)(pPinDelays + 0x1e),(float *)&pLutLib);
        for (local_168 = 0; iVar4 = Abc_ObjFaninNum(pAVar8), local_168 < iVar4;
            local_168 = local_168 + 1) {
          Abc_ObjFanin(pAVar8,local_168);
          fVar10 = Abc_ObjRequired(pAVar8);
          fVar10 = fVar10 - *(float *)((long)local_170 +
                                      (long)local_168 * 4 + (long)iVar3 * 0x84 + 0x94);
          pAVar9 = Abc_ObjFanin(pAVar8,(int)pPinDelays[(long)local_168 + 0x1e]);
          fVar11 = Abc_ObjRequired(pAVar9);
          if (fVar10 < fVar11) {
            pAVar9 = Abc_ObjFanin(pAVar8,(int)pPinDelays[(long)local_168 + 0x1e]);
            Abc_ObjSetRequired(pAVar9,fVar10);
          }
        }
      }
      fVar10 = Abc_ObjRequired(pAVar8);
      fVar11 = Abc_ObjArrival(pAVar8);
      fVar10 = fVar10 - fVar11;
      if (fVar10 + 0.001 <= 0.0) {
        __assert_fail("tSlack + 0.001 > 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                      ,0xe2,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
      }
      if (fVar10 < 0.0) {
        fVar10 = 0.0;
      }
      Abc_ObjSetSlack(pAVar8,fVar10);
    }
    Vec_PtrFree(pVVar7);
    pNtk_local._4_4_ = tSlack;
  }
  else {
    uVar1 = *(uint *)((long)local_170 + 8);
    uVar5 = Abc_NtkGetFaninMax(pNtk);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar1,
           (ulong)uVar5);
    pNtk_local._4_4_ = -1e+09;
  }
  return pNtk_local._4_4_;
}

Assistant:

float Abc_NtkDelayTraceLut( Abc_Ntk_t * pNtk, int fUseLutLib )
{
    int fUseSorting = 1;
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    float tArrival, tRequired, tSlack, * pDelays;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return -ABC_INFINITY;
    }

    // initialize the arrival times
    ABC_FREE( pNtk->pLutTimes );
    pNtk->pLutTimes = ABC_ALLOC( float, 3 * Abc_NtkObjNumMax(pNtk) );
    for ( i = 0; i < Abc_NtkObjNumMax(pNtk); i++ )
    {
        pNtk->pLutTimes[3*i+0] = pNtk->pLutTimes[3*i+2] = 0;
        pNtk->pLutTimes[3*i+1] = ABC_INFINITY;
    }

    // propagate arrival times
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        tArrival = -ABC_INFINITY;
        if ( pLutLib == NULL )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + 1.0 )
                    tArrival = Abc_ObjArrival(pFanin) + 1.0;
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[0] )
                    tArrival = Abc_ObjArrival(pFanin) + pDelays[0];
        }
        else
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k ) 
                    if ( tArrival < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] )
                        tArrival = Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k];
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                    if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[k] )
                        tArrival = Abc_ObjArrival(pFanin) + pDelays[k];
            }
        }
        if ( Abc_ObjFaninNum(pNode) == 0 )
            tArrival = 0.0;
        Abc_ObjSetArrival( pNode, tArrival );
    }
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrival = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( tArrival < Abc_ObjArrival(Abc_ObjFanin0(pNode)) )
            tArrival = Abc_ObjArrival(Abc_ObjFanin0(pNode));

    // initialize the required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( Abc_ObjRequired(Abc_ObjFanin0(pNode)) > tArrival )
            Abc_ObjSetRequired( Abc_ObjFanin0(pNode), tArrival );

    // propagate the required times
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pLutLib == NULL )
        {
            tRequired = Abc_ObjRequired(pNode) - (float)1.0;
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            tRequired = Abc_ObjRequired(pNode) - pDelays[0];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else 
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(Abc_ObjFanin(pNode,pPinPerm[k])) > tRequired )
                        Abc_ObjSetRequired( Abc_ObjFanin(pNode,pPinPerm[k]), tRequired );
                }
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(pFanin) > tRequired )
                        Abc_ObjSetRequired( pFanin, tRequired );
                }
            }
        }
        // set slack for this object
        tSlack = Abc_ObjRequired(pNode) - Abc_ObjArrival(pNode);
        assert( tSlack + 0.001 > 0.0 );
        Abc_ObjSetSlack( pNode, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_PtrFree( vNodes );
    return tArrival;
}